

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O3

AssertionResult * __thiscall
iuutil::CmpHelperEqCollections<int*,char*>
          (AssertionResult *__return_storage_ptr__,iuutil *this,char *expr1b,char *expr1e,
          char *expr2b,char *expr2e,int *b1,int *e1,char *b2,char *e2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  AssertionResult *pAVar3;
  AssertionResult ar;
  char *local_90;
  char *local_88;
  char *local_80;
  iuutil *local_78;
  AssertionResult local_70;
  AssertionResult local_48;
  pointer local_20;
  
  local_90 = expr2b;
  local_88 = expr1e;
  local_80 = expr1b;
  local_78 = this;
  CmpHelperEqIterator<int*,char*>(&local_48,(iuutil *)expr2e,b1,e1,b2,expr2e);
  if (local_48.m_result == true) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    paVar1 = &local_70.m_message.field_2;
    local_70.m_message._M_string_length = 0;
    local_70.m_message.field_2._M_local_buf[0] = '\0';
    local_70.m_result = false;
    local_70.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar3 = iutest::AssertionResult::operator<<(&local_70,(char (*) [20])"error: Expected: { ");
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char **)&local_78);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char (*) [3])0x3377cc);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,&local_80);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char (*) [9])" } == { ");
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,&local_88);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char (*) [3])0x3377cc);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,&local_90);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char (*) [13])" }\n  Actual:");
    local_20 = local_48.m_message._M_dataplus._M_p;
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,&local_20);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar2 = (pAVar3->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar3->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar3->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_70.m_message._M_dataplus._M_p,
                      CONCAT71(local_70.m_message.field_2._M_allocated_capacity._1_7_,
                               local_70.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
    operator_delete(local_48.m_message._M_dataplus._M_p,
                    local_48.m_message.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperEqCollections(const char* expr1b, const char* expr1e
    , const char* expr2b, const char* expr2e
    , T1 b1, T1 e1, T2 b2, T2 e2)
{
    if( ::iutest::AssertionResult ar = CmpHelperEqIterator(b1, e1, b2, e2) )
    {
        return ::iutest::AssertionSuccess();
    }
    else
    {
        return ::iutest::AssertionFailure() << "error: Expected: { " << expr1b << ", " << expr1e << " } == { "
            << expr2b << ", " << expr2e << " }\n  Actual:" << GetAssertionResultMessage(ar);
    }
}